

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

void Vec_VecExpand(Vec_Vec_t *p,int Level)

{
  Vec_Ptr_t *pVVar1;
  int local_18;
  int i;
  int Level_local;
  Vec_Vec_t *p_local;
  
  if (p->nSize < Level + 1) {
    Vec_PtrGrow((Vec_Ptr_t *)p,Level + 1);
    for (local_18 = p->nSize; local_18 <= Level; local_18 = local_18 + 1) {
      pVVar1 = Vec_PtrAlloc(0);
      p->pArray[local_18] = pVVar1;
    }
    p->nSize = Level + 1;
  }
  return;
}

Assistant:

static inline void Vec_VecExpand( Vec_Vec_t * p, int Level )
{
    int i;
    if ( p->nSize >= Level + 1 )
        return;
    Vec_PtrGrow( (Vec_Ptr_t *)p, Level + 1 );
    for ( i = p->nSize; i <= Level; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = Level + 1;
}